

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_update_picked_ref_frames_mask
               (MACROBLOCK *x,int ref_type,BLOCK_SIZE bsize,int mib_size,int mi_row,int mi_col)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int j;
  int i;
  int mi_size;
  int mi_col_in_sb;
  int mi_row_in_sb;
  int sb_size_mask;
  int mi_col_local;
  int mi_row_local;
  int mib_size_local;
  BLOCK_SIZE bsize_local;
  int ref_type_local;
  MACROBLOCK *x_local;
  
  uVar3 = mi_col & mib_size - 1U;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  uVar2 = mi_row & mib_size - 1U;
  for (i = uVar2; j = uVar3, i < (int)(uVar2 + bVar1); i = i + 1) {
    for (; j < (int)(uVar3 + bVar1); j = j + 1) {
      iVar4 = i * 0x20 + j;
      x->picked_ref_frames_mask[iVar4] =
           1 << ((byte)ref_type & 0x1f) | x->picked_ref_frames_mask[iVar4];
    }
  }
  return;
}

Assistant:

void av1_update_picked_ref_frames_mask(MACROBLOCK *const x, int ref_type,
                                       BLOCK_SIZE bsize, int mib_size,
                                       int mi_row, int mi_col) {
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  const int sb_size_mask = mib_size - 1;
  const int mi_row_in_sb = mi_row & sb_size_mask;
  const int mi_col_in_sb = mi_col & sb_size_mask;
  const int mi_size = mi_size_wide[bsize];
  for (int i = mi_row_in_sb; i < mi_row_in_sb + mi_size; ++i) {
    for (int j = mi_col_in_sb; j < mi_col_in_sb + mi_size; ++j) {
      x->picked_ref_frames_mask[i * 32 + j] |= 1 << ref_type;
    }
  }
}